

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

JsonNode * jsonMergePatch(JsonParse *pParse,u32 iTarget,JsonNode *pPatch)

{
  u8 *puVar1;
  uint n;
  char *__s2;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  JsonNode *pJVar7;
  uint uVar8;
  long lVar9;
  JsonNode *pJVar10;
  ulong uVar11;
  JsonNode *local_78;
  
  local_78 = pPatch;
  if (pPatch->eType == '\a') {
    if (pParse->aNode[iTarget].eType == '\a') {
      local_78 = pParse->aNode + iTarget;
      uVar6 = 1;
      uVar2 = iTarget;
      while (uVar3 = (uint)uVar6, uVar3 < pPatch->n) {
        n = pPatch[uVar6].n;
        __s2 = pPatch[uVar6].u.zJContent;
        uVar8 = local_78->n;
        uVar11 = 1;
        while (uVar5 = (uint)uVar11, uVar5 < uVar8) {
          if ((local_78[uVar11].n == n) &&
             (iVar4 = strncmp(local_78[uVar11].u.zJContent,__s2,(ulong)n), iVar4 == 0)) {
            lVar9 = uVar11 + 1;
            if ((local_78[lVar9].jnFlags & 0x14) == 0) {
              if (pPatch[uVar6 + 1].eType == '\0') {
                local_78[lVar9].jnFlags = local_78[lVar9].jnFlags | 4;
              }
              else {
                pJVar7 = jsonMergePatch(pParse,iTarget + 1 + uVar5,pPatch + uVar6 + 1);
                if (pJVar7 == (JsonNode *)0x0) {
                  return (JsonNode *)0x0;
                }
                local_78 = pParse->aNode + iTarget;
                pJVar10 = local_78 + lVar9;
                if (pJVar7 != pJVar10) {
                  (pJVar10->u).pPatch = pJVar7;
                  pJVar10->jnFlags = pJVar10->jnFlags | 0x10;
                }
              }
            }
            break;
          }
          iVar4 = 2;
          if (5 < local_78[uVar11 + 1].eType) {
            iVar4 = local_78[uVar11 + 1].n + 2;
          }
          uVar11 = (ulong)(uVar5 + iVar4);
        }
        uVar8 = uVar3 + 1;
        if ((local_78->n <= uVar5) && (pPatch[uVar8].eType != '\0')) {
          uVar5 = jsonParseAddNode(pParse,7,2,(char *)0x0);
          jsonParseAddNode(pParse,5,n,__s2);
          iVar4 = jsonParseAddNode(pParse,1,0,(char *)0x0);
          if (pParse->oom != '\0') {
            return (JsonNode *)0x0;
          }
          jsonRemoveAllNulls(pPatch);
          local_78 = pParse->aNode;
          local_78[uVar2].jnFlags = local_78[uVar2].jnFlags | 0x20;
          local_78[uVar2].u.iAppend = uVar5 - uVar2;
          pJVar7 = pParse->aNode;
          puVar1 = &pJVar7[iVar4].jnFlags;
          *puVar1 = *puVar1 | 0x10;
          local_78 = local_78 + iTarget;
          pJVar7[iVar4].u.zJContent = (char *)(pPatch + uVar8);
          uVar2 = uVar5;
        }
        iVar4 = 2;
        if (5 < pPatch[uVar8].eType) {
          iVar4 = pPatch[uVar8].n + 2;
        }
        uVar6 = (ulong)(iVar4 + uVar3);
      }
    }
    else {
      jsonRemoveAllNulls(pPatch);
    }
  }
  return local_78;
}

Assistant:

static JsonNode *jsonMergePatch(
  JsonParse *pParse,   /* The JSON parser that contains the TARGET */
  u32 iTarget,         /* Node of the TARGET in pParse */
  JsonNode *pPatch     /* The PATCH */
){
  u32 i, j;
  u32 iRoot;
  JsonNode *pTarget;
  if( pPatch->eType!=JSON_OBJECT ){
    return pPatch;
  }
  assert( iTarget<pParse->nNode );
  pTarget = &pParse->aNode[iTarget];
  assert( (pPatch->jnFlags & JNODE_APPEND)==0 );
  if( pTarget->eType!=JSON_OBJECT ){
    jsonRemoveAllNulls(pPatch);
    return pPatch;
  }
  iRoot = iTarget;
  for(i=1; i<pPatch->n; i += jsonNodeSize(&pPatch[i+1])+1){
    u32 nKey;
    const char *zKey;
    assert( pPatch[i].eType==JSON_STRING );
    assert( pPatch[i].jnFlags & JNODE_LABEL );
    assert( pPatch[i].eU==1 );
    nKey = pPatch[i].n;
    zKey = pPatch[i].u.zJContent;
    assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
    for(j=1; j<pTarget->n; j += jsonNodeSize(&pTarget[j+1])+1 ){
      assert( pTarget[j].eType==JSON_STRING );
      assert( pTarget[j].jnFlags & JNODE_LABEL );
      assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
      if( pTarget[j].n==nKey && strncmp(pTarget[j].u.zJContent,zKey,nKey)==0 ){
        if( pTarget[j+1].jnFlags & (JNODE_REMOVE|JNODE_PATCH) ) break;
        if( pPatch[i+1].eType==JSON_NULL ){
          pTarget[j+1].jnFlags |= JNODE_REMOVE;
        }else{
          JsonNode *pNew = jsonMergePatch(pParse, iTarget+j+1, &pPatch[i+1]);
          if( pNew==0 ) return 0;
          pTarget = &pParse->aNode[iTarget];
          if( pNew!=&pTarget[j+1] ){
            assert( pTarget[j+1].eU==0
                 || pTarget[j+1].eU==1
                 || pTarget[j+1].eU==2 );
            testcase( pTarget[j+1].eU==1 );
            testcase( pTarget[j+1].eU==2 );
            VVA( pTarget[j+1].eU = 5 );
            pTarget[j+1].u.pPatch = pNew;
            pTarget[j+1].jnFlags |= JNODE_PATCH;
          }
        }
        break;
      }
    }
    if( j>=pTarget->n && pPatch[i+1].eType!=JSON_NULL ){
      int iStart, iPatch;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      iPatch = jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
      if( pParse->oom ) return 0;
      jsonRemoveAllNulls(pPatch);
      pTarget = &pParse->aNode[iTarget];
      assert( pParse->aNode[iRoot].eU==0 || pParse->aNode[iRoot].eU==2 );
      testcase( pParse->aNode[iRoot].eU==2 );
      pParse->aNode[iRoot].jnFlags |= JNODE_APPEND;
      VVA( pParse->aNode[iRoot].eU = 2 );
      pParse->aNode[iRoot].u.iAppend = iStart - iRoot;
      iRoot = iStart;
      assert( pParse->aNode[iPatch].eU==0 );
      VVA( pParse->aNode[iPatch].eU = 5 );
      pParse->aNode[iPatch].jnFlags |= JNODE_PATCH;
      pParse->aNode[iPatch].u.pPatch = &pPatch[i+1];
    }
  }
  return pTarget;
}